

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keno.cpp
# Opt level: O0

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
Keno::fillKenoVector
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *__return_storage_ptr__,Keno *this)

{
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<double> __l_03;
  initializer_list<double> __l_04;
  initializer_list<double> __l_05;
  initializer_list<double> __l_06;
  initializer_list<double> __l_07;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_08;
  vector<double,_std::allocator<double>_> *local_5c0;
  allocator<std::vector<double,_std::allocator<double>_>_> local_50b;
  undefined1 local_50a;
  allocator<double> local_509;
  double local_508 [11];
  iterator local_4b0;
  size_type local_4a8;
  allocator<double> local_499;
  double local_498 [11];
  iterator local_440;
  size_type local_438;
  allocator<double> local_429;
  double local_428 [11];
  iterator local_3d0;
  size_type local_3c8;
  allocator<double> local_3b9;
  double local_3b8 [11];
  iterator local_360;
  size_type local_358;
  allocator<double> local_349;
  double local_348 [11];
  iterator local_2f0;
  size_type local_2e8;
  allocator<double> local_2d9;
  double local_2d8 [11];
  iterator local_280;
  size_type local_278;
  allocator<double> local_269;
  double local_268 [11];
  iterator local_210;
  size_type local_208;
  allocator<double> local_1f9;
  double local_1f8 [11];
  iterator local_1a0;
  size_type local_198;
  allocator<double> local_179;
  double local_178 [11];
  iterator local_120;
  size_type local_118;
  vector<double,_std::allocator<double>_> *local_110;
  vector<double,_std::allocator<double>_> local_108;
  vector<double,_std::allocator<double>_> local_f0;
  vector<double,_std::allocator<double>_> local_d8;
  vector<double,_std::allocator<double>_> local_c0;
  vector<double,_std::allocator<double>_> local_a8;
  vector<double,_std::allocator<double>_> local_90;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  vector<double,_std::allocator<double>_> local_30;
  Keno *local_18;
  Keno *this_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *kenoVector;
  
  local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  local_50a = 1;
  local_178[8] = 0.0;
  local_178[9] = 0.0;
  local_178[6] = 0.0;
  local_178[7] = 0.0;
  local_178[4] = 0.0;
  local_178[5] = 0.0;
  local_178[2] = 0.0;
  local_178[3] = 0.0;
  local_178[0] = 10.0;
  local_178[1] = 90.0;
  local_120 = local_178;
  local_118 = 10;
  local_110 = &local_108;
  local_18 = this;
  this_local = (Keno *)__return_storage_ptr__;
  std::allocator<double>::allocator(&local_179);
  __l_07._M_len = local_118;
  __l_07._M_array = local_120;
  std::vector<double,_std::allocator<double>_>::vector(&local_108,__l_07,&local_179);
  local_1f8[8] = 0.0;
  local_1f8[9] = 0.0;
  local_1f8[6] = 0.0;
  local_1f8[7] = 0.0;
  local_1f8[4] = 0.0;
  local_1f8[5] = 0.0;
  local_1f8[2] = 180.0;
  local_1f8[3] = 0.0;
  local_1f8[0] = 10.0;
  local_1f8[1] = 20.0;
  local_1a0 = local_1f8;
  local_198 = 10;
  local_110 = &local_f0;
  std::allocator<double>::allocator(&local_1f9);
  __l_06._M_len = local_198;
  __l_06._M_array = local_1a0;
  std::vector<double,_std::allocator<double>_>::vector(&local_f0,__l_06,&local_1f9);
  local_268[8] = 0.0;
  local_268[9] = 0.0;
  local_268[6] = 0.0;
  local_268[7] = 0.0;
  local_268[4] = 0.0;
  local_268[5] = 0.0;
  local_268[2] = 110.0;
  local_268[3] = 200.0;
  local_268[0] = 0.0;
  local_268[1] = 20.0;
  local_210 = local_268;
  local_208 = 10;
  local_110 = &local_d8;
  std::allocator<double>::allocator(&local_269);
  __l_05._M_len = local_208;
  __l_05._M_array = local_210;
  std::vector<double,_std::allocator<double>_>::vector(&local_d8,__l_05,&local_269);
  local_2d8[8] = 0.0;
  local_2d8[9] = 0.0;
  local_2d8[6] = 0.0;
  local_2d8[7] = 0.0;
  local_2d8[4] = 800.0;
  local_2d8[5] = 0.0;
  local_2d8[2] = 40.0;
  local_2d8[3] = 250.0;
  local_2d8[0] = 0.0;
  local_2d8[1] = 10.0;
  local_280 = local_2d8;
  local_278 = 10;
  local_110 = &local_c0;
  std::allocator<double>::allocator(&local_2d9);
  __l_04._M_len = local_278;
  __l_04._M_array = local_280;
  std::vector<double,_std::allocator<double>_>::vector(&local_c0,__l_04,&local_2d9);
  local_348[8] = 0.0;
  local_348[9] = 0.0;
  local_348[6] = 0.0;
  local_348[7] = 0.0;
  local_348[4] = 450.0;
  local_348[5] = 2000.0;
  local_348[2] = 20.0;
  local_348[3] = 80.0;
  local_348[0] = 0.0;
  local_348[1] = 10.0;
  local_2f0 = local_348;
  local_2e8 = 10;
  local_110 = &local_a8;
  std::allocator<double>::allocator(&local_349);
  __l_03._M_len = local_2e8;
  __l_03._M_array = local_2f0;
  std::vector<double,_std::allocator<double>_>::vector(&local_a8,__l_03,&local_349);
  local_3b8[8] = 0.0;
  local_3b8[9] = 0.0;
  local_3b8[6] = 3000.0;
  local_3b8[7] = 0.0;
  local_3b8[4] = 170.0;
  local_3b8[5] = 550.0;
  local_3b8[2] = 20.0;
  local_3b8[3] = 80.0;
  local_3b8[0] = 0.0;
  local_3b8[1] = 0.0;
  local_360 = local_3b8;
  local_358 = 10;
  local_110 = &local_90;
  std::allocator<double>::allocator(&local_3b9);
  __l_02._M_len = local_358;
  __l_02._M_array = local_360;
  std::vector<double,_std::allocator<double>_>::vector(&local_90,__l_02,&local_3b9);
  local_428[8] = 0.0;
  local_428[9] = 0.0;
  local_428[6] = 1100.0;
  local_428[7] = 8000.0;
  local_428[4] = 120.0;
  local_428[5] = 200.0;
  local_428[2] = 20.0;
  local_428[3] = 30.0;
  local_428[0] = 0.0;
  local_428[1] = 0.0;
  local_3d0 = local_428;
  local_3c8 = 10;
  local_110 = &local_78;
  std::allocator<double>::allocator(&local_429);
  __l_01._M_len = local_3c8;
  __l_01._M_array = local_3d0;
  std::vector<double,_std::allocator<double>_>::vector(&local_78,__l_01,&local_429);
  local_498[8] = 20000.0;
  local_498[9] = 0.0;
  local_498[6] = 650.0;
  local_498[7] = 2500.0;
  local_498[4] = 70.0;
  local_498[5] = 170.0;
  local_498[2] = 10.0;
  local_498[3] = 30.0;
  local_498[0] = 0.0;
  local_498[1] = 0.0;
  local_440 = local_498;
  local_438 = 10;
  local_110 = &local_60;
  std::allocator<double>::allocator(&local_499);
  __l_00._M_len = local_438;
  __l_00._M_array = local_440;
  std::vector<double,_std::allocator<double>_>::vector(&local_60,__l_00,&local_499);
  local_508[8] = 10000.0;
  local_508[9] = 50000.0;
  local_508[6] = 300.0;
  local_508[7] = 1000.0;
  local_508[4] = 40.0;
  local_508[5] = 110.0;
  local_508[2] = 10.0;
  local_508[3] = 20.0;
  local_508[0] = 0.0;
  local_508[1] = 0.0;
  local_4b0 = local_508;
  local_4a8 = 10;
  local_110 = &local_48;
  std::allocator<double>::allocator(&local_509);
  __l._M_len = local_4a8;
  __l._M_array = local_4b0;
  std::vector<double,_std::allocator<double>_>::vector(&local_48,__l,&local_509);
  local_50a = 0;
  local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_108;
  local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x9;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_50b);
  __l_08._M_len =
       (size_type)
       local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  __l_08._M_array =
       (iterator)
       local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,__l_08,&local_50b);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_50b);
  local_5c0 = &local_30;
  do {
    local_5c0 = local_5c0 + -1;
    std::vector<double,_std::allocator<double>_>::~vector(local_5c0);
  } while (local_5c0 != &local_108);
  std::allocator<double>::~allocator(&local_509);
  std::allocator<double>::~allocator(&local_499);
  std::allocator<double>::~allocator(&local_429);
  std::allocator<double>::~allocator(&local_3b9);
  std::allocator<double>::~allocator(&local_349);
  std::allocator<double>::~allocator(&local_2d9);
  std::allocator<double>::~allocator(&local_269);
  std::allocator<double>::~allocator(&local_1f9);
  std::allocator<double>::~allocator(&local_179);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<double>> Keno::fillKenoVector() {
	
	const std::vector<std::vector<double>>kenoVector{
				{10,90,0,0,0,0,0,0,0,0},                               //2 Numbers
				{10,20,180,0,0,0,0,0,0,0},							   //3 Numbers
				{0,20,110,200,0,0,0,0,0,0},                            //4 Numbers
				{0,10,40,250,800,0,0,0,0,0},                           //5 Numbers
				{0,10,20,80,450,2000,0,0,0,0},                         //6 Numbers
				{0,0,20,80,170,550,3000,0,0,0},                        //7 Numbers
				{0,0,20,30,120,200,1100,8000,0,0},                     //8 Numbers
				{0,0,10,30,70,170,650,2500,20000,0},                   //9 Numbers
				{0,0,10,20,40,110,300,1000,10000,50000},               //10 Number
	};

	return kenoVector;
}